

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fNegativeTextureApiTests.cpp
# Opt level: O0

deUint32 deqp::gles3::Functional::cubeFaceToGLFace(CubeFace face)

{
  deUint32 local_c;
  CubeFace face_local;
  
  switch(face) {
  case CUBEFACE_NEGATIVE_X:
    local_c = 0x8516;
    break;
  case CUBEFACE_POSITIVE_X:
    local_c = 0x8515;
    break;
  case CUBEFACE_NEGATIVE_Y:
    local_c = 0x8518;
    break;
  case CUBEFACE_POSITIVE_Y:
    local_c = 0x8517;
    break;
  case CUBEFACE_NEGATIVE_Z:
    local_c = 0x851a;
    break;
  case CUBEFACE_POSITIVE_Z:
    local_c = 0x8519;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

static deUint32 cubeFaceToGLFace (tcu::CubeFace face)
{
	switch (face)
	{
		case tcu::CUBEFACE_NEGATIVE_X: return GL_TEXTURE_CUBE_MAP_NEGATIVE_X;
		case tcu::CUBEFACE_POSITIVE_X: return GL_TEXTURE_CUBE_MAP_POSITIVE_X;
		case tcu::CUBEFACE_NEGATIVE_Y: return GL_TEXTURE_CUBE_MAP_NEGATIVE_Y;
		case tcu::CUBEFACE_POSITIVE_Y: return GL_TEXTURE_CUBE_MAP_POSITIVE_Y;
		case tcu::CUBEFACE_NEGATIVE_Z: return GL_TEXTURE_CUBE_MAP_NEGATIVE_Z;
		case tcu::CUBEFACE_POSITIVE_Z: return GL_TEXTURE_CUBE_MAP_POSITIVE_Z;
		default:
			DE_ASSERT(DE_FALSE);
			return GL_NONE;
	}
}